

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrBasic.c
# Opt level: O0

void Mtr_MakeNextSibling(MtrNode *first,MtrNode *second)

{
  MtrNode *second_local;
  MtrNode *first_local;
  
  second->younger = first->younger;
  if (first->younger != (MtrNode *)0x0) {
    first->younger->elder = second;
  }
  second->parent = first->parent;
  first->younger = second;
  second->elder = first;
  return;
}

Assistant:

void
Mtr_MakeNextSibling(
  MtrNode * first,
  MtrNode * second)
{
    second->younger = first->younger;
    if (first->younger != NULL) {
        first->younger->elder = second;
    }
    second->parent = first->parent;
    first->younger = second;
    second->elder = first;
    return;

}